

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O3

bool __thiscall Satyricon::SATSolver::solve(SATSolver *this)

{
  pointer pLVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  SATSolver *pSVar5;
  long lVar6;
  long lVar7;
  long *plVar8;
  ClausePtr conflict;
  ostream *poVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  Literal l;
  int backtrack_level;
  uint local_68;
  Literal local_64;
  ulong local_60;
  uint local_54;
  string local_50;
  
  pSVar5 = this;
  if (0 < this->log_level) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"begin solve",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    pSVar5 = (SATSolver *)std::ostream::put(-0x28);
    std::ostream::flush();
  }
  lVar6 = (long)(this->clauses).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->clauses).
                super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  lVar7 = lVar6 >> 3;
  auVar13._8_4_ = (int)(lVar6 >> 0x23);
  auVar13._0_8_ = lVar7;
  auVar13._12_4_ = 0x45300000;
  uVar11 = (ulong)(((auVar13._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) *
                  (this->param).initial_learn_mult);
  uVar12 = (this->param).restart_interval_multiplier;
  uVar3 = this->luby_next;
  this->luby_next = uVar3 + 1;
  uVar3 = next_restart_interval(pSVar5,uVar3);
  (this->param).restart_threshold = uVar3 * uVar12;
  Literal_Heap::initialize(&(this->order).order);
  local_68 = 0;
  local_60 = uVar11;
  print_status(this,0,0,(uint)uVar11);
  uVar11 = 100;
  iVar10 = 100;
  uVar12 = 0;
  while( true ) {
    while( true ) {
      if (1 < this->log_level) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"propagate at level ",0x13);
        plVar8 = (long *)std::ostream::operator<<
                                   (&std::cout,
                                    (int)((ulong)((long)(this->trail_limit).
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                 (long)(this->trail_limit).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_start) >>
                                         2));
        std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
        std::ostream::put((char)plVar8);
        std::ostream::flush();
      }
      pSVar5 = this;
      conflict = propagation(this);
      if (conflict != (ClausePtr)0x0) break;
      if ((long)(this->trail).
                super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->trail).
                super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 == (ulong)this->number_of_variable) {
        if (1 < this->log_level) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"assinged all literals without conflict",0x26);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        build_sat_proof(this);
        goto LAB_00111d7d;
      }
      if (((this->param).enable_deletion == true) &&
         ((local_60 & 0xffffffff) <=
          (ulong)((long)(this->learned).
                        super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->learned).
                        super__Vector_base<Satyricon::Clause_*,_std::allocator<Satyricon::Clause_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3))) {
        pSVar5 = this;
        reduce_learned(this);
      }
      uVar3 = (this->param).restart_threshold;
      if ((uVar3 <= uVar12 & (this->param).enable_restart) == 1) {
        uVar4 = this->luby_next;
        local_54 = (this->param).restart_interval_multiplier;
        this->luby_next = uVar4 + 1;
        uVar4 = next_restart_interval(pSVar5,uVar4);
        (this->param).restart_threshold = uVar4 * local_54 + uVar3;
        if (1 < this->log_level) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"restarting. next restart at ",0x1c);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
        local_68 = local_68 + 1;
        cancel_until(this,0);
      }
      local_64 = choice_lit(this);
      if (1 < this->log_level) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"decide literal ",0xf);
        Literal::print_abi_cxx11_(&local_50,&local_64);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                             (int)local_50._M_dataplus._M_p),
                            local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p) !=
            &local_50.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_50._M_dataplus._M_p._4_4_,(int)local_50._M_dataplus._M_p),
                          local_50.field_2._M_allocated_capacity + 1);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      assume(this,local_64);
    }
    uVar12 = uVar12 + 1;
    if ((int)((ulong)((long)(this->trail_limit).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->trail_limit).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 2) == 0) break;
    iVar10 = iVar10 + -1;
    uVar2 = local_60;
    if (iVar10 == 0) {
      uVar11 = (ulong)((double)(uVar11 & 0xffffffff) * 1.5);
      uVar3 = (int)(long)(((double)(local_60 & 0xffffffff) * (this->param).percentual_learn_increase
                          ) / 100.0) + (int)local_60;
      print_status(this,uVar12,local_68,uVar3);
      iVar10 = (int)uVar11;
      uVar2 = (ulong)uVar3;
    }
    local_60 = uVar2;
    pLVar1 = (this->solve_conflict_literals).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->solve_conflict_literals).
        super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish != pLVar1) {
      (this->solve_conflict_literals).
      super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = pLVar1;
    }
    conflict_analysis(this,conflict,&this->solve_conflict_literals,(int *)&local_50);
    cancel_until(this,(int)local_50._M_dataplus._M_p);
    learn_clause(this,&this->solve_conflict_literals);
    literals_activity_decay(this);
    clause_activity_decay(this);
  }
  if (1 < this->log_level) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"conflict at level 0, build unsat proof",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
LAB_00111d7d:
  print_status(this,uVar12,local_68,(uint)local_60);
  return conflict == (ClausePtr)0x0;
}

Assistant:

bool SATSolver::solve() {
    // main method
    PRINT("begin solve" << endl);

    // initialize search parameter
    unsigned int conflict_counter = 0;
    unsigned int restart_counter = 0;
    unsigned int learn_limit = static_cast<unsigned int>(
            static_cast<double>(clauses.size())*param.initial_learn_mult );
    param.restart_threshold = new_restart_threshold();

    unsigned int increase_limit_threshold = 100;
    unsigned int increase_limit_counter = increase_limit_threshold;

    // order literal for decision
    order.initialize_heap();

    // preprocess
    if ( param.enable_preprocessing) { preprocessing(); }

    print_status(conflict_counter,restart_counter, learn_limit);
    while ( true ) { // loop until a solution is found

        PRINT_VERBOSE("propagate at level " << current_level() << endl);
        // propagate assingment effect
        ClausePtr conflict = propagation();

        if ( conflict != nullptr ) {

            conflict_counter++;

            // if a conflict is found on level 0, it is impossible to solve
            // so the formula must be unsatisfiable
            if ( current_level() == 0 ) {
                PRINT_VERBOSE("conflict at level 0, build unsat proof" << endl);
                print_status(conflict_counter,restart_counter, learn_limit);
                return false; // UNSAT
            }

            if ( --increase_limit_counter == 0 ) {
                increase_limit_threshold *= 1.5;
                increase_limit_counter = increase_limit_threshold;
                learn_limit += static_cast<unsigned int>(
                        (learn_limit*param.percentual_learn_increase)/100.0);

                print_status(conflict_counter,restart_counter, learn_limit);
            }
            // otherwise, analize the conflict and backtrack

            int backtrack_level;
            solve_conflict_literals.clear();
            conflict_analysis(conflict,solve_conflict_literals,backtrack_level);

            cancel_until( backtrack_level );
            learn_clause(solve_conflict_literals); // learn the conflcit clause

            // after a conflict, the activity of literals and clauses decay
            literals_activity_decay();
            clause_activity_decay();
        }
        else {
            // no conflict and no more value to propagate

            // if all variables are asigned, the problem is satisfiable
            if ( number_of_assigned_variable() == number_of_variable ) {
                PRINT_VERBOSE("assinged all literals without conflict" << endl);
                build_sat_proof();
                print_status(conflict_counter,restart_counter, learn_limit);
                return true; // SAT
            }

            if ( current_level() == 0 ) {
                //simplify(clauses);
                //simplify(learned);
            }

            // if the learning limit is reached, the learned clause must
            // be reduced, the new learning limit is now higher
            if ( param.enable_deletion && learned.size() >= learn_limit ) {
                // cast for suppres warning
                reduce_learned();
            }

            if ( param.enable_restart &&
                    conflict_counter >= param.restart_threshold ) {
                // if the restart limit is reached, bactrack to level zero
                // and select the new threshold for the restart process
                restart_counter++;
                param.restart_threshold += new_restart_threshold();
                PRINT_VERBOSE("restarting. next restart at "<<
                        param.restart_threshold<< endl);
                cancel_until(0);
            }

            // open a new decision level and decide a new literal
            // based on the vsids heuristic
            Literal l = choice_lit();
            PRINT_VERBOSE("decide literal " << l << endl);
            assume(l);
        }
    }
}